

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_constraint.cpp
# Opt level: O0

void animator_changed_demon(Am_Slot slot)

{
  bool bVar1;
  uint uVar2;
  Animation_Constraint *this;
  Am_Constraint *curr;
  Am_Constraint_Iterator iter;
  Am_Slot slot_local;
  
  iter.current = (Am_Constraint_Iterator_Data *)slot.data;
  Am_Constraint_Iterator::Am_Constraint_Iterator
            ((Am_Constraint_Iterator *)&curr,(Am_Slot *)&iter.current);
  Am_Constraint_Iterator::Start((Am_Constraint_Iterator *)&curr);
  while( true ) {
    bVar1 = Am_Constraint_Iterator::Last((Am_Constraint_Iterator *)&curr);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    this = (Animation_Constraint *)Am_Constraint_Iterator::Get((Am_Constraint_Iterator *)&curr);
    uVar2 = (**(this->super_Am_Constraint).super_Am_Registered_Type._vptr_Am_Registered_Type)();
    if ((uVar2 & 0xffff) == (uint)Animation_Constraint::id) break;
    Am_Constraint_Iterator::Next((Am_Constraint_Iterator *)&curr);
  }
  Animation_Constraint::Update(this);
  return;
}

Assistant:

static void
animator_changed_demon(Am_Slot slot)
{
  Am_Constraint_Iterator iter = slot;
  Am_Constraint *curr;
  for (iter.Start(); !iter.Last(); iter.Next()) {
    curr = iter.Get();
    if (curr->ID() == Animation_Constraint::id) {
      ((Animation_Constraint *)curr)->Update();
      break;
    }
  }
}